

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O0

uint8_t * __thiscall VC1StreamReader::findNextFrame(VC1StreamReader *this,uint8_t *buffer)

{
  uint8_t *puStack_28;
  VC1Code vc1Code;
  uint8_t *nal;
  uint8_t *buffer_local;
  VC1StreamReader *this_local;
  
  puStack_28 = VC1Unit::findNextMarker
                         (buffer,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd)
  ;
  while( true ) {
    if ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + -4 <= puStack_28) {
      if (((this->super_MPEGStreamReader).m_eof & 1U) == 0) {
        this_local = (VC1StreamReader *)0x0;
      }
      else {
        this_local = (VC1StreamReader *)
                     (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      }
      return (uint8_t *)this_local;
    }
    if ((puStack_28[3] != '\f') && (puStack_28[3] != '\x1c')) break;
    puStack_28 = VC1Unit::findNextMarker
                           (puStack_28 + 4,
                            (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  }
  return puStack_28;
}

Assistant:

uint8_t* VC1StreamReader::findNextFrame(uint8_t* buffer) const
{
    for (uint8_t* nal = VC1Unit::findNextMarker(buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = VC1Unit::findNextMarker(nal + 4, m_bufEnd))
    {
        const auto vc1Code = static_cast<VC1Code>(nal[3]);
        if (vc1Code != VC1Code::FIELD && vc1Code != VC1Code::USER_FIELD)
            return nal;
    }
    if (m_eof)
        return m_bufEnd;
    return nullptr;
}